

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verifyNC.hpp
# Opt level: O3

void njoy::ENDFtk::section::Type<8,_457>::AverageDecayEnergies::verifyNC(int NC)

{
  undefined8 *puVar1;
  
  if ((NC != 3) && (NC != 0x11)) {
    tools::Log::error<char_const*>("Encountered illegal NC value");
    tools::Log::info<char_const*>("NC must be equal to either 3 or 17");
    tools::Log::info<char_const*,int>("NC value: {}",NC);
    puVar1 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar1 = getenv;
    __cxa_throw(puVar1,&std::exception::typeinfo,std::exception::~exception);
  }
  return;
}

Assistant:

static void
verifyNC( int NC ) {

  if ( ( NC != 3 ) and ( NC != 17 ) ) {

    Log::error( "Encountered illegal NC value" );
    Log::info( "NC must be equal to either 3 or 17" );
    Log::info( "NC value: {}", NC );
    throw std::exception();
  }
}